

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3EndTable(Parse *pParse,Token *pCons,Token *pEnd,u8 tabOpts,Select *pSelect)

{
  byte *pbVar1;
  short sVar2;
  u16 uVar3;
  Table *pTab;
  sqlite3 *db;
  code *pcVar4;
  sqlite3 *db_00;
  Index *pIdx;
  i16 *piVar5;
  _func_int_sqlite3_context_ptr_sqlite3_uint64 *z;
  undefined4 uVar6;
  LogEst LVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  undefined8 *puVar13;
  void *pvVar14;
  Vdbe *pVVar15;
  Parse *pPVar16;
  Table *pTVar17;
  VdbeOp *pVVar18;
  Expr *pExpr;
  ExprList *pList;
  Index *pIVar19;
  Token *pTVar20;
  ushort uVar21;
  u8 *puVar22;
  char *pcVar23;
  char *pcVar24;
  long lVar25;
  Column *pCVar26;
  ulong uVar27;
  char *pcVar28;
  int iVar29;
  Index **ppIVar30;
  char *zBuf;
  char *pcVar31;
  char *zFormat;
  bool bVar32;
  uint local_84;
  u8 *local_68;
  SelectDest dest;
  
  if (pEnd == (Token *)0x0 && pSelect == (Select *)0x0) {
    return;
  }
  pTab = pParse->pNewTable;
  if (pTab == (Table *)0x0) {
    return;
  }
  db = pParse->db;
  if (pSelect == (Select *)0x0) {
    pcVar28 = pTab->zName;
    pcVar23 = strrchr(pcVar28,0x5f);
    if (pcVar23 != (char *)0x0) {
      *pcVar23 = '\0';
      pTVar17 = sqlite3FindTable(db,pcVar28,(char *)0x0);
      *pcVar23 = '_';
      if (((((pTVar17 != (Table *)0x0) && (pTVar17->nModuleArg != 0)) &&
           (puVar13 = (undefined8 *)sqlite3HashFind(&db->aModule,*pTVar17->azModuleArg),
           puVar13 != (undefined8 *)0x0)) &&
          ((2 < *(int *)*puVar13 &&
           (pcVar4 = *(code **)((int *)*puVar13 + 0x2e), pcVar4 != (code *)0x0)))) &&
         (iVar8 = (*pcVar4)(pcVar23 + 1), iVar8 != 0)) {
        pbVar1 = (byte *)((long)&pTab->tabFlags + 1);
        *pbVar1 = *pbVar1 | 4;
      }
    }
    if (((db->init).busy != '\0') && (iVar8 = (db->init).newTnum, pTab->tnum = iVar8, iVar8 == 1)) {
      *(byte *)&pTab->tabFlags = (byte)pTab->tabFlags | 1;
    }
  }
  else if ((db->init).busy != '\0') {
    pcVar28 = "";
    goto LAB_00167959;
  }
  local_68 = &(db->init).busy;
  if ((tabOpts & 0x20) == 0) goto LAB_00167625;
  uVar12 = pTab->tabFlags;
  if ((uVar12 & 8) != 0) {
    pcVar28 = "AUTOINCREMENT not allowed on WITHOUT ROWID tables";
LAB_00167959:
    sqlite3ErrorMsg(pParse,pcVar28);
    return;
  }
  if ((uVar12 & 4) == 0) {
    sqlite3ErrorMsg(pParse,"PRIMARY KEY missing on table %s",pTab->zName);
    goto LAB_00167625;
  }
  pTab->tabFlags = uVar12 | 0x60;
  db_00 = pParse->db;
  pVVar15 = pParse->pVdbe;
  if (((db_00->init).field_0x6 & 2) == 0) {
    uVar21 = pTab->nCol;
    lVar25 = 0;
    if ((short)uVar21 < 1) {
      uVar21 = 0;
    }
    for (; (ulong)uVar21 * 0x20 != lVar25; lVar25 = lVar25 + 0x20) {
      if (((&pTab->aCol->colFlags)[lVar25] & 1) != 0) {
        (&pTab->aCol->notNull)[lVar25] = '\x02';
      }
    }
  }
  if (pParse->addrCrTab != 0) {
    pVVar18 = sqlite3VdbeGetOp(pVVar15,pParse->addrCrTab);
    pVVar18->p3 = 2;
  }
  if ((long)pTab->iPKey < 0) {
    pIVar19 = sqlite3PrimaryKeyIndex(pTab);
    iVar8 = 1;
    for (uVar27 = 1; uVar27 < pIVar19->nKeyCol; uVar27 = uVar27 + 1) {
      piVar5 = pIVar19->aiColumn;
      sVar2 = piVar5[uVar27];
      iVar9 = hasColumn(piVar5,iVar8,(int)sVar2);
      if (iVar9 == 0) {
        lVar25 = (long)iVar8;
        iVar8 = iVar8 + 1;
        piVar5[lVar25] = sVar2;
      }
      else {
        pIVar19->nColumn = pIVar19->nColumn - 1;
      }
    }
    pIVar19->nKeyCol = (u16)iVar8;
  }
  else {
    dest._0_8_ = pTab->aCol[pTab->iPKey].zName;
    iVar8 = sqlite3Strlen30((char *)dest._0_8_);
    dest.iSdst = iVar8;
    pExpr = sqlite3ExprAlloc(db_00,0x3b,(Token *)&dest,0);
    pList = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pExpr);
    if (pList == (ExprList *)0x0) goto LAB_00167625;
    pList->a[0].sortOrder = pParse->iPkSortOrder;
    sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,(uint)pTab->keyConf,
                       (Token *)0x0,(Expr *)0x0,0,0,'\x02');
    if ((db_00->mallocFailed != '\0') || (pParse->nErr != 0)) goto LAB_00167625;
    pIVar19 = sqlite3PrimaryKeyIndex(pTab);
    pTab->iPKey = -1;
  }
  uVar21 = *(ushort *)&pIVar19->field_0x63;
  *(ushort *)&pIVar19->field_0x63 = uVar21 | 0x20;
  if (((db_00->init).field_0x6 & 2) == 0) {
    *(ushort *)&pIVar19->field_0x63 = uVar21 | 0x28;
  }
  local_84 = (uint)pIVar19->nKeyCol;
  if ((pVVar15 != (Vdbe *)0x0) && (0 < pIVar19->tnum)) {
    pVVar18 = sqlite3VdbeGetOp(pVVar15,pIVar19->tnum);
    pVVar18->opcode = '\v';
  }
  pIVar19->tnum = pTab->tnum;
  ppIVar30 = &pTab->pIndex;
  while (pIdx = *ppIVar30, pIdx != (Index *)0x0) {
    if ((*(ushort *)&pIdx->field_0x63 & 3) != 2) {
      uVar21 = pIdx->nKeyCol;
      iVar8 = 0;
      for (uVar27 = 0; local_84 != uVar27; uVar27 = uVar27 + 1) {
        uVar12 = hasColumn(pIdx->aiColumn,(uint)uVar21,(int)pIVar19->aiColumn[uVar27]);
        iVar8 = iVar8 + (uVar12 ^ 1);
      }
      if (iVar8 == 0) {
        pIdx->nColumn = uVar21;
      }
      else {
        iVar8 = resizeIndexObject(db_00,pIdx,iVar8 + (uint)uVar21);
        if (iVar8 != 0) goto LAB_00167625;
        uVar12 = (uint)pIdx->nKeyCol;
        for (uVar27 = 0; local_84 != uVar27; uVar27 = uVar27 + 1) {
          piVar5 = pIdx->aiColumn;
          sVar2 = pIVar19->aiColumn[uVar27];
          iVar8 = hasColumn(piVar5,(uint)pIdx->nKeyCol,(int)sVar2);
          if (iVar8 == 0) {
            piVar5[(int)uVar12] = sVar2;
            pIdx->azColl[(int)uVar12] = pIVar19->azColl[uVar27];
            uVar12 = uVar12 + 1;
          }
        }
      }
    }
    ppIVar30 = &pIdx->pNext;
  }
  uVar3 = pTab->nCol;
  if ((int)local_84 < (int)(short)uVar3) {
    iVar8 = resizeIndexObject(db_00,pIVar19,(int)(short)uVar3);
    if (iVar8 != 0) goto LAB_00167625;
    for (iVar8 = 0; iVar8 < pTab->nCol; iVar8 = iVar8 + 1) {
      piVar5 = pIVar19->aiColumn;
      iVar9 = hasColumn(piVar5,local_84,iVar8);
      if (iVar9 == 0) {
        piVar5[(int)local_84] = (i16)iVar8;
        pIVar19->azColl[(int)local_84] = "BINARY";
        local_84 = local_84 + 1;
      }
    }
  }
  else {
    pIVar19->nColumn = uVar3;
  }
  recomputeColumnsNotIndexed(pIVar19);
LAB_00167625:
  iVar8 = sqlite3SchemaToIndex(db,pTab->pSchema);
  if (pTab->pCheck != (ExprList *)0x0) {
    sqlite3ResolveSelfReference(pParse,pTab,4,(Expr *)0x0,pTab->pCheck);
  }
  puVar22 = &pTab->aCol->szEst;
  iVar29 = 0;
  for (iVar9 = (int)pTab->nCol; 0 < iVar9; iVar9 = iVar9 + -1) {
    iVar29 = iVar29 + (uint)*puVar22;
    puVar22 = puVar22 + 0x20;
  }
  LVar7 = sqlite3LogEst((ulong)((iVar29 + (uint)((ushort)pTab->iPKey >> 0xf)) * 4));
  pTab->szTabRow = LVar7;
  ppIVar30 = &pTab->pIndex;
  while (pIVar19 = *ppIVar30, pIVar19 != (Index *)0x0) {
    estimateIndexWidth(pIVar19);
    ppIVar30 = &pIVar19->pNext;
  }
  if (*local_68 == '\0') {
    pVVar15 = sqlite3GetVdbe(pParse);
    if (pVVar15 == (Vdbe *)0x0) {
      return;
    }
    sqlite3VdbeAddOp1(pVVar15,0x75,0);
    bVar32 = pTab->pSelect == (Select *)0x0;
    pcVar28 = "VIEW";
    if (bVar32) {
      pcVar28 = "TABLE";
    }
    pcVar23 = "view";
    if (bVar32) {
      pcVar23 = "table";
    }
    if (pSelect == (Select *)0x0) {
      pTVar20 = &pParse->sLastToken;
      if (tabOpts == '\0') {
        pTVar20 = pEnd;
      }
      uVar12 = (int)pTVar20->z - (int)(pParse->sNameToken).z;
      if (*pTVar20->z != ';') {
        uVar12 = uVar12 + pTVar20->n;
      }
      pcVar28 = sqlite3MPrintf(db,"CREATE %s %.*s",pcVar28,(ulong)uVar12);
    }
    else {
      iVar10 = pParse->nMem;
      iVar9 = iVar10 + 1;
      iVar29 = iVar10 + 3;
      pParse->nMem = iVar29;
      pPVar16 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar16 = pParse;
      }
      pPVar16->mayAbort = '\x01';
      sqlite3VdbeAddOp3(pVVar15,0x6d,1,pParse->regRoot,iVar8);
      iVar11 = pVVar15->nOp;
      if (0 < (long)iVar11) {
        pVVar15->aOp[(long)iVar11 + -1].p5 = 0x10;
      }
      pParse->nTab = 2;
      sqlite3VdbeAddOp3(pVVar15,0xd,iVar9,0,iVar11 + 1);
      if (pParse->nErr != 0) {
        return;
      }
      pTVar17 = sqlite3ResultSetOfSelect(pParse,pSelect);
      if (pTVar17 == (Table *)0x0) {
        return;
      }
      pTab->nCol = pTVar17->nCol;
      pTab->aCol = pTVar17->aCol;
      pTVar17->nCol = 0;
      pTVar17->aCol = (Column *)0x0;
      sqlite3DeleteTable(db,pTVar17);
      dest.eDest = '\r';
      dest.iSDParm = iVar9;
      dest.iSdst = 0;
      dest.nSdst = 0;
      dest.zAffSdst = (char *)0x0;
      sqlite3Select(pParse,pSelect,&dest);
      if (pParse->nErr != 0) {
        return;
      }
      sqlite3VdbeEndCoroutine(pVVar15,iVar9);
      sqlite3VdbeJumpHere(pVVar15,iVar11);
      iVar9 = sqlite3VdbeAddOp1(pVVar15,0xe,dest.iSDParm);
      sqlite3VdbeAddOp3(pVVar15,0x5c,dest.iSdst,dest.nSdst,iVar10 + 2);
      lVar25 = 0;
      sqlite3TableAffinity(pVVar15,pTab,0);
      sqlite3VdbeAddOp2(pVVar15,0x79,1,iVar29);
      sqlite3VdbeAddOp3(pVVar15,0x7a,1,iVar10 + 2,iVar29);
      sqlite3VdbeGoto(pVVar15,iVar9);
      sqlite3VdbeJumpHere(pVVar15,iVar9);
      sqlite3VdbeAddOp1(pVVar15,0x75,1);
      pCVar26 = pTab->aCol;
      sVar2 = pTab->nCol;
      iVar9 = 0;
      if (0 < sVar2) {
        iVar9 = (int)sVar2;
      }
      iVar29 = 0;
      for (; iVar9 << 5 != (int)lVar25; lVar25 = lVar25 + 0x20) {
        iVar10 = identLength(*(char **)((long)&pCVar26->zName + lVar25));
        iVar29 = iVar29 + iVar10 + 5;
      }
      iVar9 = identLength(pTab->zName);
      iVar9 = iVar9 + iVar29;
      pcVar24 = ",\n  ";
      if (iVar9 < 0x32) {
        pcVar24 = ",";
      }
      pcVar31 = "\n)";
      if (iVar9 < 0x32) {
        pcVar31 = ")";
      }
      iVar29 = sVar2 * 6 + iVar9 + 0x23;
      pcVar28 = (char *)sqlite3Malloc((long)iVar29);
      if (pcVar28 == (char *)0x0) {
        sqlite3OomFault(db);
      }
      else {
        zFormat = "\n  ";
        if (iVar9 < 0x32) {
          zFormat = "";
        }
        sqlite3_snprintf(iVar29,pcVar28,"CREATE TABLE ");
        iVar9 = sqlite3Strlen30(pcVar28);
        dest._0_4_ = iVar9;
        identPut(pcVar28,(int *)&dest,pTab->zName);
        iVar10 = dest._0_4_ + 1;
        pcVar28[(int)dest._0_4_] = '(';
        pCVar26 = pTab->aCol;
        iVar9 = 0;
        while( true ) {
          zBuf = pcVar28 + iVar10;
          if (pTab->nCol <= iVar9) break;
          sqlite3_snprintf(iVar29 - iVar10,zBuf,zFormat);
          iVar11 = sqlite3Strlen30(zBuf);
          dest._0_4_ = iVar11 + iVar10;
          identPut(pcVar28,(int *)&dest,pCVar26->zName);
          z = (&sqlite3Apis.result_zeroblob64)[pCVar26->affinity];
          uVar12 = sqlite3Strlen30((char *)z);
          uVar6 = dest._0_4_;
          memcpy(pcVar28 + (int)dest._0_4_,z,(ulong)uVar12);
          iVar10 = uVar12 + uVar6;
          dest._0_4_ = iVar10;
          iVar9 = iVar9 + 1;
          pCVar26 = pCVar26 + 1;
          zFormat = pcVar24;
        }
        sqlite3_snprintf(iVar29 - iVar10,zBuf,"%s",pcVar31);
      }
    }
    sqlite3NestedParse(pParse,
                       "UPDATE %Q.%s SET type=\'%s\', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q WHERE rowid=#%d"
                       ,db->aDb[iVar8].zDbSName,"sqlite_master",pcVar23,pTab->zName,pTab->zName,
                       (ulong)(uint)pParse->regRoot,pcVar28,(ulong)(uint)pParse->regRowid);
    sqlite3DbFree(db,pcVar28);
    sqlite3ChangeCookie(pParse,iVar8);
    if (((pTab->tabFlags & 8) != 0) && ((db->aDb[iVar8].pSchema)->pSeqTab == (Table *)0x0)) {
      sqlite3NestedParse(pParse,"CREATE TABLE %Q.sqlite_sequence(name,seq)",db->aDb[iVar8].zDbSName)
      ;
    }
    pcVar28 = sqlite3MPrintf(db,"tbl_name=\'%q\' AND type!=\'trigger\'",pTab->zName);
    sqlite3VdbeAddParseSchemaOp(pVVar15,iVar8,pcVar28);
    if ((db->init).busy == '\0') {
      return;
    }
  }
  pvVar14 = sqlite3HashInsert(&pTab->pSchema->tblHash,pTab->zName,pTab);
  if (pvVar14 == (void *)0x0) {
    pParse->pNewTable = (Table *)0x0;
    *(byte *)&db->mDbFlags = (byte)db->mDbFlags | 1;
    if (pTab->pSelect == (Select *)0x0) {
      pcVar28 = (pParse->sNameToken).z;
      if (pCons->z != (char *)0x0) {
        pEnd = pCons;
      }
      iVar8 = sqlite3Utf8CharLen(pcVar28,*(int *)&pEnd->z - (int)pcVar28);
      pTab->addColOffset = iVar8 + 0xd;
    }
  }
  else {
    sqlite3OomFault(db);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3EndTable(
  Parse *pParse,          /* Parse context */
  Token *pCons,           /* The ',' token after the last column defn. */
  Token *pEnd,            /* The ')' before options in the CREATE TABLE */
  u8 tabOpts,             /* Extra table options. Usually 0. */
  Select *pSelect         /* Select from a "CREATE ... AS SELECT" */
){
  Table *p;                 /* The new table */
  sqlite3 *db = pParse->db; /* The database connection */
  int iDb;                  /* Database in which the table lives */
  Index *pIdx;              /* An implied index of the table */

  if( pEnd==0 && pSelect==0 ){
    return;
  }
  assert( !db->mallocFailed );
  p = pParse->pNewTable;
  if( p==0 ) return;

  if( pSelect==0 && isShadowTableName(db, p->zName) ){
    p->tabFlags |= TF_Shadow;
  }

  /* If the db->init.busy is 1 it means we are reading the SQL off the
  ** "sqlite_master" or "sqlite_temp_master" table on the disk.
  ** So do not write to the disk again.  Extract the root page number
  ** for the table from the db->init.newTnum field.  (The page number
  ** should have been put there by the sqliteOpenCb routine.)
  **
  ** If the root page number is 1, that means this is the sqlite_master
  ** table itself.  So mark it read-only.
  */
  if( db->init.busy ){
    if( pSelect ){
      sqlite3ErrorMsg(pParse, "");
      return;
    }
    p->tnum = db->init.newTnum;
    if( p->tnum==1 ) p->tabFlags |= TF_Readonly;
  }

  assert( (p->tabFlags & TF_HasPrimaryKey)==0
       || p->iPKey>=0 || sqlite3PrimaryKeyIndex(p)!=0 );
  assert( (p->tabFlags & TF_HasPrimaryKey)!=0
       || (p->iPKey<0 && sqlite3PrimaryKeyIndex(p)==0) );

  /* Special processing for WITHOUT ROWID Tables */
  if( tabOpts & TF_WithoutRowid ){
    if( (p->tabFlags & TF_Autoincrement) ){
      sqlite3ErrorMsg(pParse,
          "AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if( (p->tabFlags & TF_HasPrimaryKey)==0 ){
      sqlite3ErrorMsg(pParse, "PRIMARY KEY missing on table %s", p->zName);
    }else{
      p->tabFlags |= TF_WithoutRowid | TF_NoVisibleRowid;
      convertToWithoutRowidTable(pParse, p);
    }
  }

  iDb = sqlite3SchemaToIndex(db, p->pSchema);

#ifndef SQLITE_OMIT_CHECK
  /* Resolve names in all CHECK constraint expressions.
  */
  if( p->pCheck ){
    sqlite3ResolveSelfReference(pParse, p, NC_IsCheck, 0, p->pCheck);
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */

  /* Estimate the average row size for the table and for all implied indices */
  estimateTableWidth(p);
  for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
    estimateIndexWidth(pIdx);
  }

  /* If not initializing, then create a record for the new table
  ** in the SQLITE_MASTER table of the database.
  **
  ** If this is a TEMPORARY table, write the entry into the auxiliary
  ** file instead of into the main database file.
  */
  if( !db->init.busy ){
    int n;
    Vdbe *v;
    char *zType;    /* "view" or "table" */
    char *zType2;   /* "VIEW" or "TABLE" */
    char *zStmt;    /* Text of the CREATE TABLE or CREATE VIEW statement */

    v = sqlite3GetVdbe(pParse);
    if( NEVER(v==0) ) return;

    sqlite3VdbeAddOp1(v, OP_Close, 0);

    /* 
    ** Initialize zType for the new view or table.
    */
    if( p->pSelect==0 ){
      /* A regular table */
      zType = "table";
      zType2 = "TABLE";
#ifndef SQLITE_OMIT_VIEW
    }else{
      /* A view */
      zType = "view";
      zType2 = "VIEW";
#endif
    }

    /* If this is a CREATE TABLE xx AS SELECT ..., execute the SELECT
    ** statement to populate the new table. The root-page number for the
    ** new table is in register pParse->regRoot.
    **
    ** Once the SELECT has been coded by sqlite3Select(), it is in a
    ** suitable state to query for the column names and types to be used
    ** by the new table.
    **
    ** A shared-cache write-lock is not required to write to the new table,
    ** as a schema-lock must have already been obtained to create it. Since
    ** a schema-lock excludes all other database users, the write-lock would
    ** be redundant.
    */
    if( pSelect ){
      SelectDest dest;    /* Where the SELECT should store results */
      int regYield;       /* Register holding co-routine entry-point */
      int addrTop;        /* Top of the co-routine */
      int regRec;         /* A record to be insert into the new table */
      int regRowid;       /* Rowid of the next row to insert */
      int addrInsLoop;    /* Top of the loop for inserting rows */
      Table *pSelTab;     /* A table that describes the SELECT results */

      regYield = ++pParse->nMem;
      regRec = ++pParse->nMem;
      regRowid = ++pParse->nMem;
      assert(pParse->nTab==1);
      sqlite3MayAbort(pParse);
      sqlite3VdbeAddOp3(v, OP_OpenWrite, 1, pParse->regRoot, iDb);
      sqlite3VdbeChangeP5(v, OPFLAG_P2ISREG);
      pParse->nTab = 2;
      addrTop = sqlite3VdbeCurrentAddr(v) + 1;
      sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, addrTop);
      if( pParse->nErr ) return;
      pSelTab = sqlite3ResultSetOfSelect(pParse, pSelect);
      if( pSelTab==0 ) return;
      assert( p->aCol==0 );
      p->nCol = pSelTab->nCol;
      p->aCol = pSelTab->aCol;
      pSelTab->nCol = 0;
      pSelTab->aCol = 0;
      sqlite3DeleteTable(db, pSelTab);
      sqlite3SelectDestInit(&dest, SRT_Coroutine, regYield);
      sqlite3Select(pParse, pSelect, &dest);
      if( pParse->nErr ) return;
      sqlite3VdbeEndCoroutine(v, regYield);
      sqlite3VdbeJumpHere(v, addrTop - 1);
      addrInsLoop = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, dest.iSdst, dest.nSdst, regRec);
      sqlite3TableAffinity(v, p, 0);
      sqlite3VdbeAddOp2(v, OP_NewRowid, 1, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, 1, regRec, regRowid);
      sqlite3VdbeGoto(v, addrInsLoop);
      sqlite3VdbeJumpHere(v, addrInsLoop);
      sqlite3VdbeAddOp1(v, OP_Close, 1);
    }

    /* Compute the complete text of the CREATE statement */
    if( pSelect ){
      zStmt = createTableStmt(db, p);
    }else{
      Token *pEnd2 = tabOpts ? &pParse->sLastToken : pEnd;
      n = (int)(pEnd2->z - pParse->sNameToken.z);
      if( pEnd2->z[0]!=';' ) n += pEnd2->n;
      zStmt = sqlite3MPrintf(db, 
          "CREATE %s %.*s", zType2, n, pParse->sNameToken.z
      );
    }

    /* A slot for the record has already been allocated in the 
    ** SQLITE_MASTER table.  We just need to update that slot with all
    ** the information we've collected.
    */
    sqlite3NestedParse(pParse,
      "UPDATE %Q.%s "
         "SET type='%s', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q "
       "WHERE rowid=#%d",
      db->aDb[iDb].zDbSName, MASTER_NAME,
      zType,
      p->zName,
      p->zName,
      pParse->regRoot,
      zStmt,
      pParse->regRowid
    );
    sqlite3DbFree(db, zStmt);
    sqlite3ChangeCookie(pParse, iDb);

#ifndef SQLITE_OMIT_AUTOINCREMENT
    /* Check to see if we need to create an sqlite_sequence table for
    ** keeping track of autoincrement keys.
    */
    if( (p->tabFlags & TF_Autoincrement)!=0 ){
      Db *pDb = &db->aDb[iDb];
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      if( pDb->pSchema->pSeqTab==0 ){
        sqlite3NestedParse(pParse,
          "CREATE TABLE %Q.sqlite_sequence(name,seq)",
          pDb->zDbSName
        );
      }
    }
#endif

    /* Reparse everything to update our internal data structures */
    sqlite3VdbeAddParseSchemaOp(v, iDb,
           sqlite3MPrintf(db, "tbl_name='%q' AND type!='trigger'", p->zName));
  }


  /* Add the table to the in-memory representation of the database.
  */
  if( db->init.busy ){
    Table *pOld;
    Schema *pSchema = p->pSchema;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    pOld = sqlite3HashInsert(&pSchema->tblHash, p->zName, p);
    if( pOld ){
      assert( p==pOld );  /* Malloc must have failed inside HashInsert() */
      sqlite3OomFault(db);
      return;
    }
    pParse->pNewTable = 0;
    db->mDbFlags |= DBFLAG_SchemaChange;

#ifndef SQLITE_OMIT_ALTERTABLE
    if( !p->pSelect ){
      const char *zName = (const char *)pParse->sNameToken.z;
      int nName;
      assert( !pSelect && pCons && pEnd );
      if( pCons->z==0 ){
        pCons = pEnd;
      }
      nName = (int)((const char *)pCons->z - zName);
      p->addColOffset = 13 + sqlite3Utf8CharLen(zName, nName);
    }
#endif
  }
}